

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void nuke_pets(CHAR_DATA *ch)

{
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  CHAR_DATA *pet;
  bool in_stack_000000cf;
  CHAR_DATA *in_stack_000000d0;
  void *in_stack_ffffffffffffffe8;
  CHAR_DATA *ch_00;
  
  ch_00 = in_RDI->pet;
  if (ch_00 != (CHAR_DATA *)0x0) {
    stop_follower(ch_00);
    if (ch_00->in_room != (ROOM_INDEX_DATA *)0x0) {
      act(unaff_retaddr,in_RDI,ch_00,in_stack_ffffffffffffffe8,0);
    }
    extract_char(in_stack_000000d0,in_stack_000000cf);
  }
  in_RDI->pet = (CHAR_DATA *)0x0;
  return;
}

Assistant:

void nuke_pets(CHAR_DATA *ch)
{
	auto pet = ch->pet;
	if (pet != nullptr)
	{
		stop_follower(pet);
		if (pet->in_room != nullptr)
			act("$N slowly fades away.", ch, nullptr, pet, TO_NOTVICT);

		extract_char(pet, true);
	}

	ch->pet = nullptr;
}